

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yocto_obj.h
# Opt level: O0

yo__vert * yo__parse_vert(yo__vert *__return_storage_ptr__,char *str,yo__vhash *vhash,yo__vert vl)

{
  int iVar1;
  int iVar2;
  int iVar3;
  yo__vert *pyVar4;
  int local_a4;
  int local_88;
  int i_1;
  int hidx;
  int pos;
  int i;
  int *l;
  int *f;
  int iStack_60;
  yo__vert v;
  int ns;
  char *splits [5];
  yo__vhash *vhash_local;
  char *str_local;
  
  memset(&v.vid,0,0x28);
  stack0xffffffffffffffb8 = str;
  v.radius = 1;
  stack0xffffffffffffff9c = 0xffffffffffffffff;
  v.pos = -1;
  v.texcoord = -1;
  v.norm = -1;
  v.color = 0;
  for (vhash_local = (yo__vhash *)str; iVar1 = v.radius, (char)vhash_local->nverts != '\0';
      vhash_local = (yo__vhash *)((long)&vhash_local->nverts + 1)) {
    if (((char)vhash_local->nverts == '/') &&
       (*(undefined1 *)&vhash_local->nverts = 0, v.radius < 5)) {
      v.radius = v.radius + 1;
      *(undefined1 **)(&v.vid + (long)iVar1 * 2) = (undefined1 *)((long)&vhash_local->nverts + 1);
    }
  }
  for (hidx = 0; hidx < 5; hidx = hidx + 1) {
    if (*(long *)(&v.vid + (long)hidx * 2) == 0) {
      *(undefined4 *)((long)&f + (long)hidx * 4 + 4) = 0xffffffff;
    }
    else {
      iVar1 = atoi(*(char **)(&v.vid + (long)hidx * 2));
      *(int *)((long)&f + (long)hidx * 4 + 4) = iVar1;
      if (*(int *)((long)&f + (long)hidx * 4 + 4) < 0) {
        local_a4 = (&vl.pos)[hidx] + *(int *)((long)&f + (long)hidx * 4 + 4);
      }
      else {
        local_a4 = *(int *)((long)&f + (long)hidx * 4 + 4) + -1;
      }
      *(int *)((long)&f + (long)hidx * 4 + 4) = local_a4;
    }
  }
  i_1 = -1;
  iVar1 = f._4_4_ % 0x100000;
  for (local_88 = 0; local_88 < vhash->s[iVar1] && i_1 < 0; local_88 = local_88 + 1) {
    if ((((f._4_4_ == vhash->v[iVar1][local_88].pos) &&
         (iStack_60 == vhash->v[iVar1][local_88].texcoord)) &&
        (v.pos == vhash->v[iVar1][local_88].norm)) &&
       ((v.texcoord == vhash->v[iVar1][local_88].color &&
        (v.norm == vhash->v[iVar1][local_88].radius)))) {
      i_1 = local_88;
    }
  }
  if (-1 < i_1) {
    pyVar4 = vhash->v[iVar1] + i_1;
    iVar1 = pyVar4->texcoord;
    __return_storage_ptr__->pos = pyVar4->pos;
    __return_storage_ptr__->texcoord = iVar1;
    iVar1 = pyVar4->color;
    __return_storage_ptr__->norm = pyVar4->norm;
    __return_storage_ptr__->color = iVar1;
    iVar1 = pyVar4->vid;
    __return_storage_ptr__->radius = pyVar4->radius;
    __return_storage_ptr__->vid = iVar1;
    return __return_storage_ptr__;
  }
  v.color = vhash->nverts;
  if (vhash->s[iVar1] != 0) {
    iVar2 = yo__vector_capacity(vhash->s[iVar1] + 1);
    iVar3 = yo__vector_capacity(vhash->s[iVar1]);
    if (iVar2 <= iVar3) goto LAB_001b29be;
  }
  pyVar4 = vhash->v[iVar1];
  iVar2 = yo__vector_capacity(vhash->s[iVar1] + 1);
  pyVar4 = (yo__vert *)realloc(pyVar4,(long)iVar2 * 0x18);
  vhash->v[iVar1] = pyVar4;
LAB_001b29be:
  pyVar4 = vhash->v[iVar1] + vhash->s[iVar1];
  pyVar4->pos = f._4_4_;
  pyVar4->texcoord = iStack_60;
  pyVar4->norm = v.pos;
  pyVar4->color = v.texcoord;
  pyVar4->radius = v.norm;
  pyVar4->vid = v.color;
  vhash->s[iVar1] = vhash->s[iVar1] + 1;
  vhash->nverts = vhash->nverts + 1;
  __return_storage_ptr__->pos = f._4_4_;
  __return_storage_ptr__->texcoord = iStack_60;
  __return_storage_ptr__->norm = v.pos;
  __return_storage_ptr__->color = v.texcoord;
  __return_storage_ptr__->radius = v.norm;
  __return_storage_ptr__->vid = v.color;
  return __return_storage_ptr__;
}

Assistant:

static inline yo__vert
yo__parse_vert(char* str, yo__vhash* vhash, yo__vert vl) {
    // parse triplet
    char* splits[] = { str, 0, 0, 0, 0 };
    int ns = 1;
    yo__vert v = { -1, -1, -1, -1, -1 };
    while (*str) {
        if (*str == '/') {
            *str = 0;
            if (ns < 5) splits[ns++] = str + 1;
        }
        str++;
    }
    int* f = &v.pos;
    int* l = &vl.pos;
    for (int i = 0; i < 5; i++) {
        if (!splits[i]) {
            f[i] = -1;
            continue;
        }
        f[i] = (int)atoi(splits[i]);
        f[i] = (f[i] < 0) ? l[i] + f[i] : f[i] - 1;
    }

    // determine position vid using vertex hash
    int pos = -1;
    int hidx = v.pos % yo__vhash_size;
    for (int i = 0; i < vhash->s[hidx] && pos < 0; i++) {
        if (v.pos == vhash->v[hidx][i].pos &&
            v.texcoord == vhash->v[hidx][i].texcoord &&
            v.norm == vhash->v[hidx][i].norm &&
            v.color == vhash->v[hidx][i].color &&
            v.radius == vhash->v[hidx][i].radius)
            pos = i;
    }

    // found, can exit
    if (pos >= 0) return vhash->v[hidx][pos];

    // insert in vhash
    v.vid = vhash->nverts;
    yo__pushback(yo__vert, vhash->v[hidx], vhash->s[hidx], v);
    vhash->nverts++;

    return v;
}